

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.h
# Opt level: O1

void __thiscall CoreML::Specification::StringVector::add_vector(StringVector *this,char *value)

{
  int iVar1;
  Rep *pRVar2;
  Arena *this_00;
  char *pcVar3;
  LogMessage *other;
  long *elem;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (value == (char *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/../build/format/DataStructures.pb.h"
               ,0x511);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: value != NULL: ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pRVar2 = (this->vector_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_0019ab5f:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->vector_).super_RepeatedPtrFieldBase,
               (this->vector_).super_RepeatedPtrFieldBase.total_size_ + 1);
  }
  else {
    iVar1 = (this->vector_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (long *)pRVar2->elements[iVar1];
      goto LAB_0019abf1;
    }
    if (pRVar2->allocated_size == (this->vector_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_0019ab5f;
  }
  pRVar2 = (this->vector_).super_RepeatedPtrFieldBase.rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = (this->vector_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (long *)operator_new(0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
  }
  else {
    elem = (long *)google::protobuf::Arena::AllocateAligned
                             (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    *elem = (long)(elem + 2);
    elem[1] = 0;
    *(undefined1 *)(elem + 2) = 0;
    google::protobuf::Arena::AddListNode
              (this_00,elem,google::protobuf::internal::arena_destruct_object<std::__cxx11::string>)
    ;
  }
  pRVar2 = (this->vector_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (this->vector_).super_RepeatedPtrFieldBase.current_size_;
  (this->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar2->elements[iVar1] = elem;
LAB_0019abf1:
  pcVar3 = (char *)elem[1];
  strlen(value);
  std::__cxx11::string::_M_replace((ulong)elem,0,pcVar3,(ulong)value);
  return;
}

Assistant:

inline void StringVector::add_vector(const char* value) {
  GOOGLE_DCHECK(value != NULL);
  vector_.Add()->assign(value);
  // @@protoc_insertion_point(field_add_char:CoreML.Specification.StringVector.vector)
}